

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Translator_X86.cpp
# Opt level: O3

int x86AND(uchar *stream,x86Reg op1,int num)

{
  int iVar1;
  int iVar2;
  
  iVar2 = (int)stream;
  if ((int)op1 < 9) {
    if (op1 == rEAX) {
      *stream = '%';
      *(int *)(stream + 1) = num;
      iVar1 = iVar2 + 5;
      goto LAB_001bc8c3;
    }
  }
  else {
    *stream = 'A';
    stream = stream + 1;
  }
  *stream = 0x81;
  stream[1] = regCode[op1] | 0xe0;
  *(int *)(stream + 2) = num;
  iVar1 = (int)stream + 6;
LAB_001bc8c3:
  return iVar1 - iVar2;
}

Assistant:

unsigned encodeRex(unsigned char* stream, bool operand64Bit, x86Reg reg, x86Reg index, x86Reg base)
{
	unsigned char code = (operand64Bit ? 0x08 : 0x00) | (reg >= rR8 ? 0x04 : 0x00) | (index >= rR8 ? 0x02 : 0x00) | (base >= rR8 ? 0x01 : 0x00);

	if(code)
	{
		assert(sizeof(void*) == 8);

		*stream = 0x40 | code;
		return 1;
	}

	return 0;
}